

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::CreatePegoutAddressResponse::CreatePegoutAddressResponse
          (CreatePegoutAddressResponse *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_22;
  allocator local_21;
  
  (this->super_JsonClassBase<cfd::js::api::json::CreatePegoutAddressResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreatePegoutAddressResponse_00b416b0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->mainchain_address_,"",&local_21);
  std::__cxx11::string::string((string *)&this->base_descriptor_,"",&local_22);
  CollectFieldName();
  return;
}

Assistant:

CreatePegoutAddressResponse() {
    CollectFieldName();
  }